

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.cpp
# Opt level: O1

void __thiscall Vault::Client::Client(Client *this,Client *other,Token *token)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int iVar7;
  long lVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var;
  
  this->_vptr_Client = (_func_int **)&PTR__Client_001c48b0;
  iVar7 = (*other->_vptr_Client[4])(other);
  this->debug_ = SUB41(iVar7,0);
  iVar7 = (*other->_vptr_Client[5])(other);
  this->tls_ = SUB41(iVar7,0);
  (*other->_vptr_Client[6])(&this->host_,other);
  (*other->_vptr_Client[7])(&this->port_,other);
  paVar1 = &(this->token_).value_.field_2;
  (this->token_).value_._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (token->value_)._M_dataplus._M_p;
  paVar2 = &(token->value_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined4 *)((long)&(token->value_).field_2 + 4);
    uVar5 = *(undefined4 *)((long)&(token->value_).field_2 + 8);
    uVar6 = *(undefined4 *)((long)&(token->value_).field_2 + 0xc);
    *(undefined4 *)paVar1 = *(undefined4 *)paVar2;
    *(undefined4 *)((long)&(this->token_).value_.field_2 + 4) = uVar4;
    *(undefined4 *)((long)&(this->token_).value_.field_2 + 8) = uVar5;
    *(undefined4 *)((long)&(this->token_).value_.field_2 + 0xc) = uVar6;
  }
  else {
    (this->token_).value_._M_dataplus._M_p = pcVar3;
    (this->token_).value_.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->token_).value_._M_string_length = (token->value_)._M_string_length;
  (token->value_)._M_dataplus._M_p = (pointer)paVar2;
  (token->value_)._M_string_length = 0;
  (token->value_).field_2._M_local_buf[0] = '\0';
  (*other->_vptr_Client[9])(&this->namespace_,other);
  iVar7 = (*other->_vptr_Client[10])(other);
  lVar8 = CONCAT44(extraout_var,iVar7);
  (this->httpClient_)._vptr_HttpClient = (_func_int **)&PTR__HttpClient_001c4a58;
  Config::Config(&(this->httpClient_).config_,(Config *)(lVar8 + 8));
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  function(&(this->httpClient_).errorCallback_,
           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            *)(lVar8 + 0xb8));
  std::function<void_(const_Vault::HttpResponse_&)>::function
            (&(this->httpClient_).responseErrorCallback_,
             (function<void_(const_Vault::HttpResponse_&)> *)(lVar8 + 0xd8));
  iVar7 = (*other->_vptr_Client[0xb])(other);
  this->authStrategy_ = (AuthenticationStrategy *)CONCAT44(extraout_var_00,iVar7);
  (*other->_vptr_Client[0xc])(&this->caBundle_,other);
  return;
}

Assistant:

Vault::Client::Client(const Vault::Client &other, Vault::Token token)
    : debug_(other.getDebug())
    , tls_(other.getTls())
    , host_(other.getHost())
    , port_(other.getPort())
    , token_(std::move(token))
    , namespace_(other.getNamespace())
    , httpClient_(other.getHttpClient())
    , authStrategy_(other.getAuthenticationStrategy())
    , caBundle_(other.getCaBundle()) {}